

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_visuals.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_visuals::load_ogfs(xr_level_visuals *this,xr_reader *r,xr_level_geom *geom)

{
  byte bVar1;
  size_t sVar2;
  xr_ogf_v4 *pxVar3;
  xr_vbuf_vec *pxVar4;
  xr_ibuf_vec *pxVar5;
  xr_swibuf_vec *ext_swibufs;
  xr_ogf_v4 *local_60;
  xr_ogf_v4 *local_58;
  xr_ogf_v4 *ogf_1;
  xr_ogf_v4 *local_38;
  xr_ogf_v3 *ogf;
  ogf_version version;
  uint32_t id;
  xr_reader *s;
  xr_level_geom *geom_local;
  xr_reader *r_local;
  xr_level_visuals *this_local;
  
  ogf._4_4_ = 0;
  s = (xr_reader *)geom;
  geom_local = (xr_level_geom *)r;
  r_local = (xr_reader *)this;
  while( true ) {
    _version = xr_reader::open_chunk((xr_reader *)geom_local,ogf._4_4_);
    if (_version == (xr_reader *)0x0) {
      return;
    }
    sVar2 = xr_reader::find_chunk(_version,1);
    if (sVar2 == 0) break;
    bVar1 = xr_reader::r_u8(_version);
    ogf._0_4_ = (uint)bVar1;
    if ((uint)ogf == 3) {
      pxVar3 = (xr_ogf_v4 *)operator_new(0x770);
      xr_ogf_v3::xr_ogf_v3((xr_ogf_v3 *)pxVar3);
      local_38 = pxVar3;
      (*(pxVar3->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
        [0x15])(pxVar3,_version);
      pxVar3 = local_38;
      pxVar4 = xr_level_geom::vbufs((xr_level_geom *)s);
      pxVar5 = xr_level_geom::ibufs((xr_level_geom *)s);
      xr_ogf_v3::set_ext_geom((xr_ogf_v3 *)pxVar3,pxVar4,pxVar5);
      ogf_1 = local_38;
      std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::push_back
                (&this->m_ogfs,(value_type *)&ogf_1);
    }
    else {
      if ((uint)ogf != 4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_visuals.cxx"
                      ,0x45,
                      "void xray_re::xr_level_visuals::load_ogfs(xr_reader &, const xr_level_geom *)"
                     );
      }
      pxVar3 = (xr_ogf_v4 *)operator_new(0x7b8);
      xr_ogf_v4::xr_ogf_v4(pxVar3);
      local_58 = pxVar3;
      (*(pxVar3->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
        [0x15])(pxVar3,_version);
      pxVar3 = local_58;
      pxVar4 = xr_level_geom::vbufs((xr_level_geom *)s);
      pxVar5 = xr_level_geom::ibufs((xr_level_geom *)s);
      ext_swibufs = xr_level_geom::swibufs((xr_level_geom *)s);
      xr_ogf_v4::set_ext_geom(pxVar3,pxVar4,pxVar5,ext_swibufs);
      local_60 = local_58;
      std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::push_back
                (&this->m_ogfs,(value_type *)&local_60);
    }
    xr_reader::close_chunk((xr_reader *)geom_local,(xr_reader **)&version);
    ogf._4_4_ = ogf._4_4_ + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_visuals.cxx"
                ,0x35,
                "void xray_re::xr_level_visuals::load_ogfs(xr_reader &, const xr_level_geom *)");
}

Assistant:

void xr_level_visuals::load_ogfs(xr_reader& r, const xr_level_geom* geom)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
		if (!s->find_chunk(OGF_HEADER))
			xr_not_expected();
		ogf_version version = static_cast<ogf_version>(s->r_u8());
		switch (version) {
			case 3: {
				xr_ogf_v3 * ogf = new xr_ogf_v3;
				ogf->load_ogf(*s);
				ogf->set_ext_geom(geom->vbufs(), geom->ibufs());
				m_ogfs.push_back(ogf);
				} break;
			case 4: {
				xr_ogf_v4 * ogf = new xr_ogf_v4;
				ogf->load_ogf(*s);
				ogf->set_ext_geom(geom->vbufs(), geom->ibufs(), geom->swibufs());
				m_ogfs.push_back(ogf);
				} break;
			default:
				xr_not_expected();
		}
		r.close_chunk(s);
	}
}